

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBrokerData.cpp
# Opt level: O0

void __thiscall
helics::NetworkBrokerData::checkAndUpdateBrokerAddress
          (NetworkBrokerData *this,string_view localAddress)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  size_type in_stack_ffffffffffffff50;
  allocator<char> *__n;
  undefined1 in_stack_ffffffffffffff68 [16];
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  allocator<char> local_39 [41];
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (ulong)*(byte *)&in_RDI[0xe]._M_str;
  switch(this_00) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    if (((bVar1) ||
        (bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38), bVar1
        )) || (bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38),
              bVar1)) {
      std::__cxx11::string::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    if (((bVar1) ||
        (bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38), bVar1
        )) || (bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38),
              bVar1)) {
      std::__cxx11::string::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    if ((bVar1) ||
       (bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38), bVar1)
       ) {
      __n = local_39;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff68._8_8_
                );
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      std::__cxx11::string::~string(in_stack_ffffffffffffff40);
      std::allocator<char>::~allocator(local_39);
      iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (in_stack_ffffffffffffff68._8_8_,in_stack_ffffffffffffff68._0_8_,
                         (size_type)this_00,(char *)in_RDI);
      if (iVar2 == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::substr
                  ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(size_type)in_RDI,
                   (size_type)__n);
        std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                  (this_00,in_RDI);
      }
      else {
        std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                  (this_00,in_RDI);
      }
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      if ((bVar1) ||
         (bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38),
         bVar1)) {
        this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &stack0xffffffffffffff7f;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff68._8_8_);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        std::__cxx11::string::~string(this_01);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
        iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                          (in_stack_ffffffffffffff68._8_8_,in_stack_ffffffffffffff68._0_8_,
                           (size_type)this_00,(char *)in_RDI);
        if (iVar2 == 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(size_type)in_RDI,
                     in_stack_ffffffffffffff50);
          std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                    (this_00,in_RDI);
        }
        else {
          std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                    (this_00,in_RDI);
        }
      }
      else {
        bVar1 = std::operator==(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
        if (bVar1) {
          std::__cxx11::string::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        }
      }
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
  default:
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4087b1);
    if ((bVar1) &&
       (bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10), !bVar1
       )) {
      std::__cxx11::string::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
  }
  return;
}

Assistant:

void NetworkBrokerData::checkAndUpdateBrokerAddress(std::string_view localAddress)
{
    using gmlc::networking::InterfaceTypes;
    switch (allowedType) {
        case InterfaceTypes::TCP:
            if ((brokerAddress == "tcp://*") || (brokerAddress == "*") ||
                (brokerAddress == "tcp")) {  // the broker address can't use a wild card
                brokerAddress = localAddress;
            }
            break;
        case InterfaceTypes::UDP:
            if ((brokerAddress == "udp://*") || (brokerAddress == "*") ||
                (brokerAddress == "udp")) {  // the broker address can't use a wild card
                brokerAddress = localAddress;
            }
            break;
        case InterfaceTypes::IP:
            if ((brokerAddress == "udp://*") ||
                (brokerAddress == "udp")) {  // the broker address can't use a wild card
                brokerAddress = std::string("udp://");
                if (localAddress.compare(3, 3, "://") == 0) {
                    brokerAddress.append(localAddress.substr(6));
                } else {
                    brokerAddress.append(localAddress);
                }
            } else if ((brokerAddress == "tcp://*") ||
                       (brokerAddress == "tcp")) {  // the broker address can't use a wild card
                brokerAddress = std::string("tcp://");
                if (localAddress.compare(3, 3, "://") == 0) {
                    brokerAddress.append(localAddress.substr(6));
                } else {
                    brokerAddress.append(localAddress);
                }
            } else if (brokerAddress == "*") {
                brokerAddress = localAddress;
            }
            break;
        case InterfaceTypes::IPC:
        case InterfaceTypes::INPROC:
        default:
            if ((brokerAddress.empty()) && (!localAddress.empty())) {
                brokerAddress = localAddress;
            }
            break;
    }
}